

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

tuple<bool,_float,_cv::Mat> *
removeBlurIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  float fVar1;
  bool local_392;
  bool local_391;
  _OutputArray local_390;
  _InputArray local_378;
  _InputArray local_360;
  Mat local_348 [8];
  Mat sharpened;
  Mat local_2e8 [352];
  MatExpr local_188 [8];
  Mat edges;
  Size_<int> local_128;
  _OutputArray local_120;
  _InputArray local_108;
  Mat local_f0 [8];
  Mat smoothened;
  Mat local_80 [100];
  float local_1c;
  Mat *pMStack_18;
  float blurPercentage;
  Mat *inputImg_local;
  
  pMStack_18 = inputImg;
  inputImg_local = (Mat *)__return_storage_ptr__;
  cv::Mat::Mat(local_80,inputImg);
  fVar1 = calculateEdginess(local_80);
  cv::Mat::~Mat(local_80);
  local_1c = fVar1;
  if (fVar1 <= 68.0) {
    local_392 = false;
    std::make_tuple<bool,float&,cv::Mat_const&>
              (__return_storage_ptr__,&local_392,&local_1c,pMStack_18);
  }
  else {
    cv::Mat::Mat(local_f0);
    cv::_InputArray::_InputArray(&local_108,pMStack_18);
    cv::_OutputArray::_OutputArray(&local_120,local_f0);
    cv::Size_<int>::Size_(&local_128,0x17,0x17);
    cv::GaussianBlur(0x4014000000000000,&local_108,&local_120,&local_128,4);
    cv::_OutputArray::~_OutputArray(&local_120);
    cv::_InputArray::~_InputArray(&local_108);
    cv::operator-(local_2e8,pMStack_18);
    cv::MatExpr::operator_cast_to_Mat(local_188);
    cv::MatExpr::~MatExpr((MatExpr *)local_2e8);
    cv::Mat::Mat(local_348);
    cv::_InputArray::_InputArray(&local_360,pMStack_18);
    cv::_InputArray::_InputArray(&local_378,(Mat *)local_188);
    cv::_OutputArray::_OutputArray(&local_390,local_348);
    cv::addWeighted(&local_360,1.0,&local_378,0.7,0.0,&local_390,-1);
    cv::_OutputArray::~_OutputArray(&local_390);
    cv::_InputArray::~_InputArray(&local_378);
    cv::_InputArray::~_InputArray(&local_360);
    local_391 = true;
    std::make_tuple<bool,float&,cv::Mat&>(__return_storage_ptr__,&local_391,&local_1c,local_348);
    cv::Mat::~Mat(local_348);
    cv::Mat::~Mat((Mat *)local_188);
    cv::Mat::~Mat(local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeBlurIfPresent(Mat const& inputImg) {
    float blurPercentage = calculateEdginess(inputImg);
    if (blurPercentage > 68) {
        Mat smoothened;
        GaussianBlur(inputImg, smoothened,Size(23, 23), 5,5);
        Mat edges = inputImg - smoothened;
        Mat sharpened;
        addWeighted(inputImg, 1, edges, 0.7, 0,sharpened);
        return make_tuple(true, blurPercentage, sharpened);
    } else {
        return make_tuple(false, blurPercentage, inputImg);
    }
}